

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

int64_t read_int(MIR_context_t ctx,char *err_msg)

{
  int iVar1;
  uint64_t uVar2;
  int64_t iVar3;
  undefined8 *puVar4;
  
  iVar1 = get_byte(ctx);
  if (0xfffffff7 < iVar1 - 0x11U) {
    uVar2 = get_uint(ctx,iVar1 + -8);
    return uVar2;
  }
  puVar4 = (undefined8 *)0x2;
  iVar3 = (*ctx->error_func)(MIR_binary_io_error,err_msg);
  if ((puVar4 != (undefined8 *)0x0) && (puVar4[2] != 0)) {
    *puVar4 = 0;
    return iVar3;
  }
  mir_varr_assert_fail("trunc","uint8_t");
}

Assistant:

static int64_t read_int (MIR_context_t ctx, const char *err_msg) {
  int c = get_byte (ctx);

  if (TAG_I1 > c || c > TAG_I8) MIR_get_error_func (ctx) (MIR_binary_io_error, err_msg);
  return get_int (ctx, c - TAG_I1 + 1);
}